

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  seqDef *psVar4;
  bool bVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  BYTE *pBVar12;
  U32 UVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  long lVar17;
  int *piVar18;
  ulong uVar19;
  uint uVar20;
  U32 UVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int *piVar25;
  U32 UVar26;
  U32 UVar27;
  size_t ofbCandidate;
  BYTE *litEnd;
  U32 maxDistance;
  BYTE *litLimit_w;
  size_t local_c0;
  seqStore_t *local_b8;
  int *local_b0;
  BYTE *local_a8;
  ZSTD_matchState_t *local_a0;
  U32 local_94;
  int local_90;
  uint local_8c;
  int *local_88;
  ulong local_80;
  BYTE *local_78;
  BYTE *local_70;
  ulong local_68;
  BYTE *local_60;
  int *local_58;
  BYTE *local_50;
  int *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  pBVar14 = (BYTE *)((long)src + srcSize);
  local_58 = (int *)((long)src + (srcSize - 8));
  local_60 = (ms->window).base;
  pBVar15 = (ms->window).dictBase;
  uVar22 = (ms->window).dictLimit;
  uVar11 = (ulong)uVar22;
  local_70 = local_60 + uVar11;
  uVar9 = (ms->window).lowLimit;
  uVar3 = (ms->cParams).windowLog;
  uVar7 = (ms->cParams).minMatch;
  uVar20 = 6;
  if (uVar7 < 6) {
    uVar20 = uVar7;
  }
  uVar7 = 4;
  if (4 < uVar20) {
    uVar7 = uVar20;
  }
  UVar27 = *rep;
  local_94 = rep[1];
  ms->lazySkipping = 0;
  piVar18 = (int *)((ulong)(local_70 == (BYTE *)src) + (long)src);
  local_88 = (int *)src;
  local_40 = rep;
  if (piVar18 < local_58) {
    local_50 = pBVar15 + uVar11;
    local_38 = pBVar15 + uVar9;
    local_8c = 1 << ((byte)uVar3 & 0x1f);
    local_90 = uVar22 - 1;
    local_48 = (int *)(pBVar14 + -0x20);
    local_b8 = seqStore;
    local_a8 = pBVar14;
    local_a0 = ms;
    local_80 = uVar11;
    local_78 = pBVar15;
    do {
      uVar22 = (int)piVar18 - (int)local_60;
      local_68 = (ulong)uVar22;
      iVar8 = uVar22 + 1;
      UVar26 = (ms->window).lowLimit;
      UVar13 = iVar8 - local_8c;
      if (iVar8 - UVar26 <= local_8c) {
        UVar13 = UVar26;
      }
      if (ms->loadedDictEnd != 0) {
        UVar13 = UVar26;
      }
      uVar9 = iVar8 - UVar27;
      pBVar12 = local_60;
      if (uVar9 < (uint)uVar11) {
        pBVar12 = pBVar15;
      }
      if (local_90 - uVar9 < 3) {
LAB_01288daf:
        uVar24 = 0;
      }
      else {
        uVar24 = 0;
        if (UVar27 <= (uVar22 - UVar13) + 1) {
          if (*(int *)((long)piVar18 + 1) != *(int *)(pBVar12 + uVar9)) goto LAB_01288daf;
          pBVar15 = pBVar14;
          if (uVar9 < (uint)uVar11) {
            pBVar15 = local_50;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar18 + 5),(BYTE *)((long)(pBVar12 + uVar9) + 4),
                              pBVar14,pBVar15,local_70);
          uVar24 = sVar10 + 4;
        }
      }
      local_c0 = 999999999;
      if (uVar7 == 6) {
        uVar11 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar18,pBVar14,&local_c0);
      }
      else if (uVar7 == 5) {
        uVar11 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar18,pBVar14,&local_c0);
      }
      else {
        uVar11 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar18,pBVar14,&local_c0);
      }
      uVar19 = uVar24;
      if (uVar24 < uVar11) {
        uVar19 = uVar11;
      }
      if (uVar19 < 4) {
        uVar11 = (long)piVar18 - (long)local_88;
        piVar18 = (int *)((long)piVar18 + (uVar11 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar11);
        pBVar14 = local_a8;
        uVar11 = local_80;
        pBVar15 = local_78;
        UVar13 = local_94;
      }
      else {
        local_b0 = piVar18;
        uVar23 = local_c0;
        if (uVar11 <= uVar24) {
          local_b0 = (int *)((long)piVar18 + 1);
          uVar23 = 1;
        }
        uVar11 = local_68;
        if (piVar18 < local_58) {
          do {
            piVar1 = (int *)((long)piVar18 + 1);
            uVar22 = (int)uVar11 + 1;
            local_68 = uVar11;
            if (uVar23 == 0) {
              uVar23 = 0;
            }
            else {
              UVar26 = (ms->window).lowLimit;
              UVar13 = uVar22 - local_8c;
              if (uVar22 - UVar26 <= local_8c) {
                UVar13 = UVar26;
              }
              if (ms->loadedDictEnd != 0) {
                UVar13 = UVar26;
              }
              uVar9 = uVar22 - UVar27;
              pBVar14 = local_60;
              if (uVar9 < (uint)local_80) {
                pBVar14 = local_78;
              }
              if (((2 < local_90 - uVar9) && (UVar27 <= uVar22 - UVar13)) &&
                 (*piVar1 == *(int *)(pBVar14 + uVar9))) {
                pBVar15 = local_a8;
                if (uVar9 < (uint)local_80) {
                  pBVar15 = local_50;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar18 + 5),
                                    (BYTE *)((long)(pBVar14 + uVar9) + 4),local_a8,pBVar15,local_70)
                ;
                ms = local_a0;
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar9 = 0x1f;
                  if ((uint)uVar23 != 0) {
                    for (; (uint)uVar23 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                    }
                  }
                  if ((int)((uVar9 ^ 0x1f) + (int)uVar19 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                    uVar23 = 1;
                    uVar19 = sVar10 + 4;
                    local_b0 = piVar1;
                  }
                }
              }
            }
            local_c0 = 999999999;
            if (uVar7 == 6) {
              uVar11 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar1,local_a8,&local_c0);
            }
            else if (uVar7 == 5) {
              uVar11 = ZSTD_HcFindBestMatch_extDict_5(local_a0,(BYTE *)piVar1,local_a8,&local_c0);
            }
            else {
              uVar11 = ZSTD_HcFindBestMatch_extDict_4(local_a0,(BYTE *)piVar1,local_a8,&local_c0);
            }
            bVar5 = true;
            if (3 < uVar11) {
              uVar9 = 0x1f;
              if ((uint)uVar23 != 0) {
                for (; (uint)uVar23 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              iVar8 = 0x1f;
              if ((uint)local_c0 != 0) {
                for (; (uint)local_c0 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                }
              }
              if ((int)((uVar9 ^ 0x1f) + (int)uVar19 * 4 + -0x1b) < (int)uVar11 * 4 - iVar8) {
                bVar5 = false;
                uVar19 = uVar11;
                uVar23 = local_c0;
                local_b0 = piVar1;
              }
            }
            piVar25 = local_b0;
            ms = local_a0;
            if (bVar5) {
              if (local_58 <= piVar1) break;
              piVar1 = (int *)((long)piVar18 + 2);
              uVar22 = (int)local_68 + 2;
              local_68 = (ulong)uVar22;
              if (uVar23 == 0) {
                uVar23 = 0;
              }
              else {
                UVar26 = (local_a0->window).lowLimit;
                UVar13 = uVar22 - local_8c;
                if (uVar22 - UVar26 <= local_8c) {
                  UVar13 = UVar26;
                }
                if (local_a0->loadedDictEnd != 0) {
                  UVar13 = UVar26;
                }
                uVar9 = uVar22 - UVar27;
                pBVar14 = local_60;
                if (uVar9 < (uint)local_80) {
                  pBVar14 = local_78;
                }
                if (((2 < local_90 - uVar9) && (UVar27 <= uVar22 - UVar13)) &&
                   (*piVar1 == *(int *)(pBVar14 + uVar9))) {
                  pBVar15 = local_a8;
                  if (uVar9 < (uint)local_80) {
                    pBVar15 = local_50;
                  }
                  sVar10 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar18 + 6),
                                      (BYTE *)((long)(pBVar14 + uVar9) + 4),local_a8,pBVar15,
                                      local_70);
                  if (sVar10 < 0xfffffffffffffffc) {
                    uVar22 = 0x1f;
                    if ((uint)uVar23 != 0) {
                      for (; (uint)uVar23 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                      }
                    }
                    if ((int)((uVar22 ^ 0x1f) + (int)uVar19 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                      uVar23 = 1;
                      uVar19 = sVar10 + 4;
                      piVar25 = piVar1;
                    }
                  }
                }
              }
              ms = local_a0;
              local_c0 = 999999999;
              if (uVar7 == 6) {
                uVar11 = ZSTD_HcFindBestMatch_extDict_6(local_a0,(BYTE *)piVar1,local_a8,&local_c0);
              }
              else if (uVar7 == 5) {
                uVar11 = ZSTD_HcFindBestMatch_extDict_5(local_a0,(BYTE *)piVar1,local_a8,&local_c0);
              }
              else {
                uVar11 = ZSTD_HcFindBestMatch_extDict_4(local_a0,(BYTE *)piVar1,local_a8,&local_c0);
              }
              bVar5 = true;
              if (3 < uVar11) {
                uVar22 = 0x1f;
                if ((uint)uVar23 != 0) {
                  for (; (uint)uVar23 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                  }
                }
                iVar8 = 0x1f;
                if ((uint)local_c0 != 0) {
                  for (; (uint)local_c0 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                  }
                }
                if ((int)((uVar22 ^ 0x1f) + (int)uVar19 * 4 + -0x18) < (int)uVar11 * 4 - iVar8) {
                  bVar5 = false;
                  uVar19 = uVar11;
                  uVar23 = local_c0;
                  piVar25 = piVar1;
                }
              }
              uVar11 = local_68;
              piVar18 = piVar1;
              local_b0 = piVar25;
              if (bVar5) break;
            }
            else {
              uVar11 = (ulong)uVar22;
              piVar18 = piVar1;
            }
          } while (piVar18 < local_58);
        }
        pBVar15 = local_78;
        UVar26 = UVar27;
        UVar13 = local_94;
        if (3 < uVar23) {
          pBVar16 = (BYTE *)((long)local_b0 + (3 - (long)(local_60 + uVar23)));
          pBVar12 = local_70;
          pBVar14 = local_60;
          if ((uint)pBVar16 < (uint)local_80) {
            pBVar12 = local_38;
            pBVar14 = local_78;
          }
          if ((local_88 < local_b0) &&
             (uVar11 = (ulong)pBVar16 & 0xffffffff, pBVar12 < pBVar14 + uVar11)) {
            pBVar14 = pBVar14 + uVar11;
            do {
              piVar18 = (int *)((long)local_b0 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar18 != *pBVar14) ||
                 (uVar19 = uVar19 + 1, local_b0 = piVar18, piVar18 <= local_88)) break;
            } while (pBVar12 < pBVar14);
          }
          UVar26 = (U32)uVar23 - 3;
          UVar13 = UVar27;
        }
        uVar11 = (long)local_b0 - (long)local_88;
        if (local_48 < local_b0) {
          ZSTD_safecopyLiterals(local_b8->lit,(BYTE *)local_88,(BYTE *)local_b0,(BYTE *)local_48);
          ms = local_a0;
        }
        else {
          pBVar14 = local_b8->lit;
          uVar6 = *(undefined8 *)(local_88 + 2);
          *(undefined8 *)pBVar14 = *(undefined8 *)local_88;
          *(undefined8 *)(pBVar14 + 8) = uVar6;
          if (0x10 < uVar11) {
            pBVar14 = local_b8->lit;
            uVar6 = *(undefined8 *)(local_88 + 6);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(local_88 + 4);
            *(undefined8 *)(pBVar14 + 0x18) = uVar6;
            if (0x20 < (long)uVar11) {
              lVar17 = 0;
              do {
                puVar2 = (undefined8 *)((long)local_88 + lVar17 + 0x20);
                uVar6 = puVar2[1];
                pBVar12 = pBVar14 + lVar17 + 0x20;
                *(undefined8 *)pBVar12 = *puVar2;
                *(undefined8 *)(pBVar12 + 8) = uVar6;
                puVar2 = (undefined8 *)((long)local_88 + lVar17 + 0x30);
                uVar6 = puVar2[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                lVar17 = lVar17 + 0x20;
              } while (pBVar12 + 0x20 < pBVar14 + uVar11);
            }
          }
        }
        pBVar14 = local_a8;
        local_b8->lit = local_b8->lit + uVar11;
        if (0xffff < uVar11) {
          local_b8->longLengthType = ZSTD_llt_literalLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4 = local_b8->sequences;
        psVar4->litLength = (U16)uVar11;
        psVar4->offBase = (U32)uVar23;
        if (0xffff < uVar19 - 3) {
          local_b8->longLengthType = ZSTD_llt_matchLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar19 - 3);
        local_b8->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar18 = (int *)((long)local_b0 + uVar19);
        uVar11 = local_80;
        local_88 = piVar18;
        do {
          UVar27 = UVar26;
          if (local_58 < piVar18) break;
          iVar8 = (int)piVar18 - (int)local_60;
          UVar27 = (ms->window).lowLimit;
          UVar21 = iVar8 - local_8c;
          if (iVar8 - UVar27 <= local_8c) {
            UVar21 = UVar27;
          }
          if (ms->loadedDictEnd != 0) {
            UVar21 = UVar27;
          }
          uVar22 = iVar8 - UVar13;
          pBVar12 = local_60;
          if (uVar22 < (uint)uVar11) {
            pBVar12 = pBVar15;
          }
          if (((local_90 - uVar22 < 3) || (iVar8 - UVar21 < UVar13)) ||
             (*piVar18 != *(int *)(pBVar12 + uVar22))) {
            bVar5 = false;
            UVar27 = UVar13;
          }
          else {
            pBVar15 = pBVar14;
            if (uVar22 < (uint)uVar11) {
              pBVar15 = local_50;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar18 + 1),(BYTE *)((long)(pBVar12 + uVar22) + 4),pBVar14
                                ,pBVar15,local_70);
            pBVar15 = local_b8->lit;
            if (local_48 < local_88) {
              ZSTD_safecopyLiterals(pBVar15,(BYTE *)local_88,(BYTE *)local_88,(BYTE *)local_48);
            }
            else {
              uVar6 = *(undefined8 *)(local_88 + 2);
              *(undefined8 *)pBVar15 = *(undefined8 *)local_88;
              *(undefined8 *)(pBVar15 + 8) = uVar6;
            }
            psVar4 = local_b8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (0xffff < sVar10 + 1) {
              local_b8->longLengthType = ZSTD_llt_matchLength;
              local_b8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)local_b8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar10 + 1);
            local_b8->sequences = psVar4 + 1;
            piVar18 = (int *)((long)piVar18 + sVar10 + 4);
            bVar5 = true;
            uVar11 = local_80;
            pBVar15 = local_78;
            UVar27 = UVar26;
            UVar26 = UVar13;
            local_88 = piVar18;
          }
          UVar13 = UVar27;
          UVar27 = UVar26;
        } while (bVar5);
      }
      local_94 = UVar13;
    } while (piVar18 < local_58);
  }
  *local_40 = UVar27;
  local_40[1] = local_94;
  return (long)pBVar14 - (long)local_88;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}